

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
          (FlatBufferBuilderImpl<false> *this,FlatBufferBuilderImpl<false> *other)

{
  uint max_size;
  size_t buffer_minalign;
  FlatBufferBuilderImpl<false> *other_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  buffer_minalign = AlignOf<unsigned_long>();
  max_size = std::numeric_limits<int>::max();
  vector_downward<unsigned_int>::vector_downward
            (&this->buf_,0x400,(Allocator *)0x0,false,buffer_minalign,max_size);
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  this->length_of_64_bit_region_ = 0;
  this->nested = false;
  this->finished = false;
  this->minalign_ = 1;
  this->force_defaults_ = false;
  this->dedup_vtables_ = true;
  this->string_pool = (StringOffsetMap *)0x0;
  EndianCheck();
  Swap(this,other);
  return;
}

Assistant:

FlatBufferBuilderImpl(FlatBufferBuilderImpl &&other) noexcept
      : buf_(1024, nullptr, false, AlignOf<largest_scalar_t>(),
             static_cast<SizeT>(Is64Aware ? FLATBUFFERS_MAX_64_BUFFER_SIZE
                                          : FLATBUFFERS_MAX_BUFFER_SIZE)),
        num_field_loc(0),
        max_voffset_(0),
        length_of_64_bit_region_(0),
        nested(false),
        finished(false),
        minalign_(1),
        force_defaults_(false),
        dedup_vtables_(true),
        string_pool(nullptr) {
    EndianCheck();
    // Default construct and swap idiom.
    // Lack of delegating constructors in vs2010 makes it more verbose than
    // needed.
    Swap(other);
  }